

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

int onig_get_capture_range_in_callout(OnigCalloutArgs *a,int mem_num,int *begin,int *end)

{
  OnigRegex pOVar1;
  StackType *pSVar2;
  StkPtrType *pSVar3;
  int iVar4;
  int local_80;
  uint local_74;
  int local_70;
  uint local_64;
  StkPtrType *mem_end_stk;
  StkPtrType *mem_start_stk;
  int i;
  StackType *stk_base;
  OnigUChar *str;
  OnigRegex reg;
  int *end_local;
  int *begin_local;
  int mem_num_local;
  OnigCalloutArgs *a_local;
  
  pOVar1 = a->regex;
  pSVar2 = a->stk_base;
  pSVar3 = a->mem_end_stk;
  if (mem_num < 1) {
    a_local._4_4_ = -0x1e;
  }
  else {
    if (a->mem_end_stk[mem_num].i == -1) {
      *end = -1;
      *begin = -1;
    }
    else {
      if (mem_num < 0x20) {
        local_64 = pOVar1->push_mem_start & 1 << ((byte)mem_num & 0x1f);
      }
      else {
        local_64 = pOVar1->push_mem_start & 1;
      }
      if (local_64 == 0) {
        local_70 = (int)a->mem_start_stk[mem_num].i;
      }
      else {
        local_70 = (int)*(undefined8 *)&pSVar2[a->mem_start_stk[mem_num].i].u;
      }
      iVar4 = (int)a->string;
      *begin = local_70 - iVar4;
      if (mem_num < 0x20) {
        local_74 = pOVar1->push_mem_end & 1 << ((byte)mem_num & 0x1f);
      }
      else {
        local_74 = pOVar1->push_mem_end & 1;
      }
      if (local_74 == 0) {
        local_80 = (int)pSVar3[mem_num].i;
      }
      else {
        local_80 = (int)*(undefined8 *)&pSVar2[pSVar3[mem_num].i].u;
      }
      *end = local_80 - iVar4;
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

extern int
onig_get_capture_range_in_callout(OnigCalloutArgs* a, int mem_num, int* begin, int* end)
{
  OnigRegex    reg;
  const UChar* str;
  StackType*   stk_base;
  int i;
  StkPtrType* mem_start_stk;
  StkPtrType* mem_end_stk;

  i = mem_num;
  reg = a->regex;
  str = a->string;
  stk_base = a->stk_base;
  mem_start_stk = a->mem_start_stk;
  mem_end_stk   = a->mem_end_stk;

  if (i > 0) {
    if (a->mem_end_stk[i].i != INVALID_STACK_INDEX) {
      *begin = (int )(STACK_MEM_START(reg, i) - str);
      *end   = (int )(STACK_MEM_END(reg, i)   - str);
    }
    else {
      *begin = *end = ONIG_REGION_NOTPOS;
    }
  }
  else
    return ONIGERR_INVALID_ARGUMENT;

  return ONIG_NORMAL;
}